

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::setSpelling(MidiMessage *this,int base7,int accidental)

{
  bool bVar1;
  int iVar2;
  byte local_1d;
  uchar vel;
  uchar spelling;
  int dpc;
  int accidental_local;
  int base7_local;
  MidiMessage *this_local;
  
  bVar1 = isNoteOn(this);
  if (bVar1) {
    iVar2 = getVelocity(this);
    if (iVar2 < 4) {
      setVelocity(this,4);
    }
    local_1d = 0;
    switch(base7 % 7) {
    case 0:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 2;
        break;
      case 2:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 1;
      }
      break;
    case 1:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 3;
        break;
      case 2:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 1;
      }
      break;
    case 2:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 3;
        break;
      case 2:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 2;
      }
      break;
    case 3:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 2;
        break;
      case 2:
        local_1d = 3;
        break;
      case 3:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 1;
      }
      break;
    case 4:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 2;
        break;
      case 2:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 1;
      }
      break;
    case 5:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 3;
        break;
      case 2:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 1;
      }
      break;
    case 6:
      switch(accidental) {
      case 0:
        local_1d = 2;
        break;
      case 1:
        local_1d = 3;
        break;
      case 2:
        local_1d = 3;
        break;
      case -2:
        local_1d = 1;
        break;
      case -1:
        local_1d = 2;
      }
    }
    iVar2 = getVelocity(this);
    setVelocity(this,(uint)((byte)iVar2 & 0xfc | local_1d));
  }
  return;
}

Assistant:

void MidiMessage::setSpelling(int base7, int accidental) {
	if (!isNoteOn()) {
		return;
	}
	// The bottom two bits of the attack velocity are used for the
	// spelling, so need to make sure the velocity will not accidentally
	// be set to zero (and make the note-on a note-off).
	if (getVelocity() < 4) {
		setVelocity(4);
	}
	int dpc = base7 % 7;
	uchar spelling = 0;

	// Table 5.1, page 101 in Beyond MIDI (1997)
	// http://beyondmidi.ccarh.org/beyondmidi-600dpi.pdf
	switch (dpc) {

		case 0:
			switch (accidental) {
				case -2: spelling = 1; break; // Cbb
				case -1: spelling = 1; break; // Cb
				case  0: spelling = 2; break; // C
				case +1: spelling = 2; break; // C#
				case +2: spelling = 3; break; // C##
			}
			break;

		case 1:
			switch (accidental) {
				case -2: spelling = 1; break; // Dbb
				case -1: spelling = 1; break; // Db
				case  0: spelling = 2; break; // D
				case +1: spelling = 3; break; // D#
				case +2: spelling = 3; break; // D##
			}
			break;

		case 2:
			switch (accidental) {
				case -2: spelling = 1; break; // Ebb
				case -1: spelling = 2; break; // Eb
				case  0: spelling = 2; break; // E
				case +1: spelling = 3; break; // E#
				case +2: spelling = 3; break; // E##
			}
			break;

		case 3:
			switch (accidental) {
				case -2: spelling = 1; break; // Fbb
				case -1: spelling = 1; break; // Fb
				case  0: spelling = 2; break; // F
				case +1: spelling = 2; break; // F#
				case +2: spelling = 3; break; // F##
				case +3: spelling = 3; break; // F###
			}
			break;

		case 4:
			switch (accidental) {
				case -2: spelling = 1; break; // Gbb
				case -1: spelling = 1; break; // Gb
				case  0: spelling = 2; break; // G
				case +1: spelling = 2; break; // G#
				case +2: spelling = 3; break; // G##
			}
			break;

		case 5:
			switch (accidental) {
				case -2: spelling = 1; break; // Abb
				case -1: spelling = 1; break; // Ab
				case  0: spelling = 2; break; // A
				case +1: spelling = 3; break; // A#
				case +2: spelling = 3; break; // A##
			}
			break;

		case 6:
			switch (accidental) {
				case -2: spelling = 1; break; // Bbb
				case -1: spelling = 2; break; // Bb
				case  0: spelling = 2; break; // B
				case +1: spelling = 3; break; // B#
				case +2: spelling = 3; break; // B##
			}
			break;

	}

	uchar vel = getVelocity();
	// suppress any previous content in the first two bits:
	vel = vel & 0xFC;
	// insert the spelling code:
	vel = vel | spelling;
	setVelocity(vel);
}